

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O1

void __thiscall
SimpleStringInternalCache::releaseNonCachedMemory
          (SimpleStringInternalCache *this,char *memory,size_t size)

{
  SimpleStringMemoryBlock *pSVar1;
  SimpleStringMemoryBlock *pSVar2;
  SimpleStringMemoryBlock *blockToFree;
  
  pSVar2 = this->nonCachedAllocations_;
  if ((pSVar2 != (SimpleStringMemoryBlock *)0x0) && (pSVar2->memory_ == memory)) {
    this->nonCachedAllocations_ = pSVar2->next_;
    (*this->allocator_->_vptr_TestMemoryAllocator[3])();
    (*this->allocator_->_vptr_TestMemoryAllocator[3])
              (this->allocator_,pSVar2,0x10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
               ,0x70);
    return;
  }
  pSVar2 = this->nonCachedAllocations_;
  do {
    if (pSVar2 == (SimpleStringMemoryBlock *)0x0) {
LAB_002b52ad:
      printDeallocatingUnknownMemory(this,memory);
      return;
    }
    pSVar1 = pSVar2->next_;
    if ((pSVar1 != (SimpleStringMemoryBlock *)0x0) && (pSVar1->memory_ == memory)) {
      pSVar2->next_ = pSVar1->next_;
      (*this->allocator_->_vptr_TestMemoryAllocator[3])();
      (*this->allocator_->_vptr_TestMemoryAllocator[3])
                (this->allocator_,pSVar1,0x10,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleStringInternalCache.cpp"
                 ,0x70);
      if (pSVar2 != (SimpleStringMemoryBlock *)0x0) {
        return;
      }
      goto LAB_002b52ad;
    }
    pSVar2 = pSVar2->next_;
  } while( true );
}

Assistant:

void SimpleStringInternalCache::releaseNonCachedMemory(char* memory, size_t size)
{
    if (nonCachedAllocations_ && nonCachedAllocations_->memory_ == memory) {
        SimpleStringMemoryBlock* block = nonCachedAllocations_;
        nonCachedAllocations_ = block->next_;
        destroySimpleStringMemoryBlock(block, size);
        return;
    }

    for (SimpleStringMemoryBlock* block = nonCachedAllocations_; block; block = block->next_) {
        if (block->next_ && block->next_->memory_ == memory) {
            SimpleStringMemoryBlock* blockToFree = block->next_;
            block->next_ = block->next_->next_;
            destroySimpleStringMemoryBlock(blockToFree, size);
            return;
        }
    }

    printDeallocatingUnknownMemory(memory);
}